

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_low_entropy_ref(aec_stream_conflict *strm)

{
  uint *puVar1;
  uint uVar2;
  internal_state_conflict *piVar3;
  byte *pbVar4;
  uint *puVar5;
  internal_state_conflict *piVar6;
  int iVar7;
  code *pcVar8;
  size_t sVar9;
  ulong uVar10;
  internal_state_conflict *state;
  
  piVar3 = strm->state;
  if (piVar3->ref != 0) {
    uVar2 = strm->bits_per_sample;
    iVar7 = piVar3->bitp;
    if (iVar7 < (int)uVar2) {
      sVar9 = strm->avail_in;
      do {
        sVar9 = sVar9 - 1;
        if (sVar9 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar9;
        uVar10 = piVar3->acc << 8;
        piVar3->acc = uVar10;
        pbVar4 = strm->next_in;
        strm->next_in = pbVar4 + 1;
        piVar3->acc = *pbVar4 | uVar10;
        iVar7 = iVar7 + 8;
        piVar3->bitp = iVar7;
      } while (iVar7 < (int)uVar2);
    }
    uVar10 = strm->avail_out;
    if (uVar10 < piVar3->bytes_per_sample) {
      return 0;
    }
    puVar5 = piVar3->rsip;
    puVar1 = puVar5 + 1;
    piVar3->rsip = puVar1;
    *puVar5 = (uint)(piVar3->acc >> ((char)iVar7 - (char)uVar2 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar2 & 0x3fU));
    strm->avail_out = uVar10 - piVar3->bytes_per_sample;
    piVar6 = piVar3;
    if (piVar3->rsi_size == (long)puVar1 - (long)piVar3->rsi_buffer >> 2) {
      (*piVar3->flush_output)(strm);
      piVar3->flush_start = piVar3->rsi_buffer;
      piVar3->rsip = piVar3->rsi_buffer;
      piVar6 = strm->state;
    }
    piVar6->bitp = piVar6->bitp - strm->bits_per_sample;
  }
  pcVar8 = m_zero_block;
  if (piVar3->id == 1) {
    pcVar8 = m_se;
  }
  piVar3->mode = pcVar8;
  return 1;
}

Assistant:

static int m_low_entropy_ref(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->ref && copysample(strm) == 0)
        return M_EXIT;

    if(state->id == 1) {
        state->mode = m_se;
        return M_CONTINUE;
    }

    state->mode = m_zero_block;
    return M_CONTINUE;
}